

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O1

void PDHG_Init_Variables(CUPDLPwork *work)

{
  CUPDLPiterates *pCVar1;
  CUPDLPdata *pCVar2;
  CUPDLPstepsize *pCVar3;
  CUPDLPvec *x;
  CUPDLPvec *y;
  CUPDLPvec *ax;
  CUPDLPvec *aty;
  int iVar4;
  
  pCVar1 = work->iterates;
  pCVar2 = work->problem->data;
  pCVar3 = work->stepsize;
  iVar4 = work->timers->nIter % 2;
  x = pCVar1->x[iVar4];
  y = pCVar1->y[iVar4];
  ax = pCVar1->ax[iVar4];
  aty = pCVar1->aty[iVar4];
  memset(x->data,0,(long)pCVar2->nCols << 3);
  PDHG_Project_Bounds(work,x->data);
  memset(y->data,0,(long)pCVar2->nRows << 3);
  Ax(work,ax,x);
  ATy(work,aty,y);
  memset(pCVar1->xSum,0,(long)pCVar2->nCols << 3);
  memset(pCVar1->ySum,0,(long)pCVar2->nRows << 3);
  memset(pCVar1->xAverage->data,0,(long)pCVar2->nCols << 3);
  memset(pCVar1->yAverage->data,0,(long)pCVar2->nRows << 3);
  PDHG_Project_Bounds(work,pCVar1->xSum);
  PDHG_Project_Bounds(work,pCVar1->xAverage->data);
  pCVar3->dSumPrimalStep = 0.0;
  pCVar3->dSumDualStep = 0.0;
  memset(pCVar1->xLastRestart,0,(long)pCVar2->nCols << 3);
  memset(pCVar1->yLastRestart,0,(long)pCVar2->nRows << 3);
  return;
}

Assistant:

void PDHG_Init_Variables(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  CUPDLP_ZERO_VEC(x->data, cupdlp_float, lp->nCols);

  // XXX: PDLP Does not project x0,  so we uncomment for 1-1 comparison

  PDHG_Project_Bounds(work, x->data);

  // cupdlp_zero(iterates->y, cupdlp_float, lp->nRows);
  CUPDLP_ZERO_VEC(y->data, cupdlp_float, lp->nRows);

  // Ax(work, iterates->ax, iterates->x);
  // ATyCPU(work, iterates->aty, iterates->y);
  Ax(work, ax, x);
  ATy(work, aty, y);

  // cupdlp_zero(iterates->xSum, cupdlp_float, lp->nCols);
  // cupdlp_zero(iterates->ySum, cupdlp_float, lp->nRows);
  // cupdlp_zero(iterates->xAverage, cupdlp_float, lp->nCols);
  // cupdlp_zero(iterates->yAverage, cupdlp_float, lp->nRows);
  CUPDLP_ZERO_VEC(iterates->xSum, cupdlp_float, lp->nCols);
  CUPDLP_ZERO_VEC(iterates->ySum, cupdlp_float, lp->nRows);
  CUPDLP_ZERO_VEC(iterates->xAverage->data, cupdlp_float, lp->nCols);
  CUPDLP_ZERO_VEC(iterates->yAverage->data, cupdlp_float, lp->nRows);

  PDHG_Project_Bounds(work, iterates->xSum);
  PDHG_Project_Bounds(work, iterates->xAverage->data);

  stepsize->dSumPrimalStep = 0.0;
  stepsize->dSumDualStep = 0.0;

  CUPDLP_ZERO_VEC(iterates->xLastRestart, cupdlp_float, lp->nCols);
  CUPDLP_ZERO_VEC(iterates->yLastRestart, cupdlp_float, lp->nRows);
}